

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

tokenStream * lexer::parsefile(string *filename)

{
  tokenStream *ptVar1;
  string local_558;
  undefined1 local_528 [8];
  tokenizer tokenizer;
  string current_value;
  string line;
  ifstream fileStream;
  string *filename_local;
  
  std::ifstream::ifstream((void *)((long)&line.field_2 + 8));
  std::__cxx11::string::string((string *)(current_value.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&tokenizer.token_stream);
  ::tokenizer::tokenizer((tokenizer *)local_528);
  std::__cxx11::string::string((string *)&local_558,filename);
  ::tokenizer::process_file((tokenizer *)local_528,&local_558);
  std::__cxx11::string::~string((string *)&local_558);
  ptVar1 = ::tokenizer::get_token_stream((tokenizer *)local_528);
  ::tokenizer::~tokenizer((tokenizer *)local_528);
  std::__cxx11::string::~string((string *)&tokenizer.token_stream);
  std::__cxx11::string::~string((string *)(current_value.field_2._M_local_buf + 8));
  std::ifstream::~ifstream((void *)((long)&line.field_2 + 8));
  return ptVar1;
}

Assistant:

tokenStream *lexer::parsefile(string filename){
    ifstream fileStream;

    string line;

    string current_value;

    tokenizer tokenizer;

    tokenizer.process_file(std::move(filename));

    return tokenizer.get_token_stream();
}